

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseArgs
          (Token *__return_storage_ptr__,Parser *this,ArgParams *args,string *element_kind,
          bool *got_comma)

{
  _List_node_base *p_Var1;
  Allocator *this_00;
  Kind KVar2;
  bool bVar3;
  _Self __tmp;
  ostream *poVar4;
  StaticError *this_01;
  Identifier *id;
  Fodder comma_fodder;
  AST *expr;
  Fodder eq_fodder;
  Fodder id_fodder;
  stringstream ss;
  undefined1 local_3f0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [11];
  Token next;
  Token local_1b0;
  Token local_f0;
  
  *got_comma = false;
  bVar3 = true;
  do {
    Token::Token(&next,(Token *)((this->tokens->
                                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                 )._M_impl._M_node.super__List_node_base._M_next + 1));
    KVar2 = next.kind;
    if (next.kind == PAREN_R) {
      pop(__return_storage_ptr__,this);
    }
    else {
      if ((!bVar3) && (*got_comma == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar4 = std::operator<<((ostream *)(local_3f0 + 8),"expected a comma before next ");
        poVar4 = std::operator<<(poVar4,(string *)element_kind);
        std::operator<<(poVar4,".");
        this_01 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(this_01,&next.location,(string *)&comma_fodder);
        __cxa_throw(this_01,&StaticError::typeinfo,StaticError::~StaticError);
      }
      id_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      id_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      id_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      id = (Identifier *)0x0;
      eq_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      eq_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      eq_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var1 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (*(int *)&p_Var1[1]._M_next == 10) {
        Token::Token((Token *)&ss,(Token *)((long)p_Var1->_M_next + 0x10));
        if (_ss == OPERATOR) {
          bVar3 = std::operator==(local_3d8,"=");
          if (bVar3) {
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(&id_fodder,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)((long)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1) + 8));
            this_00 = this->alloc;
            Token::data32_abi_cxx11_
                      ((UString *)&comma_fodder,
                       (Token *)((this->tokens->
                                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                 )._M_impl._M_node.super__List_node_base._M_next + 1));
            id = Allocator::makeIdentifier(this_00,(UString *)&comma_fodder);
            std::__cxx11::u32string::~u32string((u32string *)&comma_fodder);
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(&eq_fodder,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)local_3f0);
            pop(&local_f0,this);
            Token::~Token(&local_f0);
            pop(&local_1b0,this);
            Token::~Token(&local_1b0);
          }
        }
        Token::~Token((Token *)&ss);
      }
      expr = parse(this,0xf);
      *got_comma = false;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 4) {
        pop((Token *)&ss,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&comma_fodder,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)local_3f0);
        *got_comma = true;
        Token::~Token((Token *)&ss);
      }
      std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>> *)
                 args,&id_fodder,&id,&eq_fodder,&expr,&comma_fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&comma_fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&eq_fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&id_fodder);
      bVar3 = false;
    }
    Token::~Token(&next);
    if (KVar2 == PAREN_R) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Token parseArgs(ArgParams &args, const std::string &element_kind, bool &got_comma)
    {
        got_comma = false;
        bool first = true;
        do {
            Token next = peek();
            if (next.kind == Token::PAREN_R) {
                // got_comma can be true or false here.
                return pop();
            }
            if (!first && !got_comma) {
                std::stringstream ss;
                ss << "expected a comma before next " << element_kind << ".";
                throw StaticError(next.location, ss.str());
            }
            // Either id=expr or id or expr, but note that expr could be id==1 so this needs
            // look-ahead.
            Fodder id_fodder;
            const Identifier *id = nullptr;
            Fodder eq_fodder;
            if (peek().kind == Token::IDENTIFIER) {
                Token maybe_eq = doublePeek();
                if (maybe_eq.kind == Token::OPERATOR && maybe_eq.data == "=") {
                    id_fodder = peek().fodder;
                    id = alloc->makeIdentifier(peek().data32());
                    eq_fodder = maybe_eq.fodder;
                    pop();  // id
                    pop();  // eq
                }
            }
            AST *expr = parse(MAX_PRECEDENCE);
            got_comma = false;
            first = false;
            Fodder comma_fodder;
            if (peek().kind == Token::COMMA) {
                Token comma = pop();
                comma_fodder = comma.fodder;
                got_comma = true;
            }
            args.emplace_back(id_fodder, id, eq_fodder, expr, comma_fodder);
        } while (true);
    }